

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

xchar ledger_to_dnum(xchar ledgerno)

{
  int local_10;
  int i;
  xchar ledgerno_local;
  
  local_10 = 0;
  while( true ) {
    if (n_dgns <= local_10) {
      panic("level number out of range [ledger_to_dnum(%d)]",(ulong)(uint)(int)ledgerno);
    }
    if ((dungeons[local_10].ledger_start < (int)ledgerno) &&
       ((int)ledgerno <= dungeons[local_10].ledger_start + (int)dungeons[local_10].num_dunlevs))
    break;
    local_10 = local_10 + 1;
  }
  return (xchar)local_10;
}

Assistant:

xchar ledger_to_dnum(xchar ledgerno)
{
	int i;

	/* find i such that (i->base + 1) <= ledgerno <= (i->base + i->count) */
	for (i = 0; i < n_dgns; i++)
	    if (dungeons[i].ledger_start < ledgerno &&
		ledgerno <= dungeons[i].ledger_start + dungeons[i].num_dunlevs)
		return (xchar)i;

	panic("level number out of range [ledger_to_dnum(%d)]", (int)ledgerno);
	/*NOT REACHED*/
	return (xchar)0;
}